

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O2

qint64 __thiscall
QNativeSocketEngine::readDatagram
          (QNativeSocketEngine *this,char *data,qint64 maxSize,QIpPacketHeader *header,
          PacketHeaderOptions options)

{
  QNativeSocketEnginePrivate *this_00;
  char cVar1;
  qint64 qVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  char local_50 [24];
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QNativeSocketEnginePrivate **)(this + 8);
  cVar1 = (**(code **)(*(long *)this + 0x78))();
  if (cVar1 == '\0') {
    pcVar3 = "QNativeSocketEngine::readDatagram() was called on an uninitialized socket device";
  }
  else {
    if ((this_00->super_QAbstractSocketEnginePrivate).socketState - ConnectedState < 2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        qVar2 = QNativeSocketEnginePrivate::nativeReceiveDatagram
                          (this_00,data,maxSize,header,options);
        return qVar2;
      }
      goto LAB_001b8ff1;
    }
    pcVar3 = 
    "QNativeSocketEngine::readDatagram() was called not in QAbstractSocket::BoundState or QAbstractSocket::ConnectedState"
    ;
  }
  local_38 = "default";
  local_50[0x14] = '\0';
  local_50[0x15] = '\0';
  local_50[0x16] = '\0';
  local_50[0x17] = '\0';
  local_50[0xc] = '\0';
  local_50[0xd] = '\0';
  local_50[0xe] = '\0';
  local_50[0xf] = '\0';
  local_50[0x10] = '\0';
  local_50[0x11] = '\0';
  local_50[0x12] = '\0';
  local_50[0x13] = '\0';
  local_50[4] = '\0';
  local_50[5] = '\0';
  local_50[6] = '\0';
  local_50[7] = '\0';
  local_50[8] = '\0';
  local_50[9] = '\0';
  local_50[10] = '\0';
  local_50[0xb] = '\0';
  local_50[0] = '\x02';
  local_50[1] = '\0';
  local_50[2] = '\0';
  local_50[3] = '\0';
  QMessageLogger::warning(local_50,pcVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return -1;
  }
LAB_001b8ff1:
  __stack_chk_fail();
}

Assistant:

qint64 QNativeSocketEngine::readDatagram(char *data, qint64 maxSize, QIpPacketHeader *header,
                                         PacketHeaderOptions options)
{
    Q_D(QNativeSocketEngine);
    Q_CHECK_VALID_SOCKETLAYER(QNativeSocketEngine::readDatagram(), -1);
    Q_CHECK_STATES(QNativeSocketEngine::readDatagram(), QAbstractSocket::BoundState,
                   QAbstractSocket::ConnectedState, -1);

    return d->nativeReceiveDatagram(data, maxSize, header, options);
}